

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O0

int poll_dispatch(event_base *base,timeval *tv)

{
  int top;
  ushort uVar1;
  uint uVar2;
  void *pvVar3;
  int *piVar4;
  int what;
  pollfd *tmp;
  pollfd *event_set;
  pollop *pop;
  long msec;
  int nfds;
  int j;
  int i;
  int res;
  timeval *tv_local;
  event_base *base_local;
  
  pop._0_4_ = -1;
  piVar4 = (int *)base->evbase;
  top = piVar4[1];
  if (base->th_base_lock == (void *)0x0) {
    tmp = *(pollfd **)(piVar4 + 4);
  }
  else {
    if (piVar4[2] != 0) {
      pvVar3 = event_mm_realloc_(*(void **)(piVar4 + 6),(long)*piVar4 << 3);
      if (pvVar3 == (void *)0x0) {
        event_warn("realloc");
        return -1;
      }
      *(void **)(piVar4 + 6) = pvVar3;
      piVar4[2] = 0;
    }
    memcpy(*(void **)(piVar4 + 6),*(void **)(piVar4 + 4),(long)top << 3);
    tmp = *(pollfd **)(piVar4 + 6);
  }
  if (tv != (timeval *)0x0) {
    pop = (pollop *)evutil_tv_to_msec_(tv);
    if (((long)pop < 0) || (0x7fffffff < (long)pop)) {
      pop = (pollop *)0x7fffffff;
    }
  }
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
  }
  uVar2 = poll((pollfd *)tmp,(long)top,(int)pop);
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,base->th_base_lock);
  }
  if (uVar2 == 0xffffffff) {
    piVar4 = __errno_location();
    if (*piVar4 == 4) {
      base_local._4_4_ = 0;
    }
    else {
      event_warn("poll");
      base_local._4_4_ = -1;
    }
  }
  else {
    if (event_debug_logging_mask_ != 0) {
      event_debugx_("%s: poll reports %d","poll_dispatch",(ulong)uVar2);
    }
    if ((uVar2 == 0) || (top == 0)) {
      base_local._4_4_ = 0;
    }
    else {
      nfds = evutil_weakrand_range_(&base->weakrand_seed,top);
      for (msec._4_4_ = 0; msec._4_4_ < top; msec._4_4_ = msec._4_4_ + 1) {
        nfds = nfds + 1;
        if (nfds == top) {
          nfds = 0;
        }
        uVar1 = tmp[nfds].revents;
        if (uVar1 != 0) {
          j = 0;
          if ((uVar1 & 0x38) != 0) {
            uVar1 = uVar1 | 5;
          }
          if ((uVar1 & 1) != 0) {
            j = 2;
          }
          if ((uVar1 & 4) != 0) {
            j = j | 4;
          }
          if (j != 0) {
            evmap_io_active_(base,tmp[nfds].fd,(short)j);
          }
        }
      }
      base_local._4_4_ = 0;
    }
  }
  return base_local._4_4_;
}

Assistant:

static int
poll_dispatch(struct event_base *base, struct timeval *tv)
{
	int res, i, j, nfds;
	long msec = -1;
	struct pollop *pop = base->evbase;
	struct pollfd *event_set;

	poll_check_ok(pop);

	nfds = pop->nfds;

#ifndef EVENT__DISABLE_THREAD_SUPPORT
	if (base->th_base_lock) {
		/* If we're using this backend in a multithreaded setting,
		 * then we need to work on a copy of event_set, so that we can
		 * let other threads modify the main event_set while we're
		 * polling. If we're not multithreaded, then we'll skip the
		 * copy step here to save memory and time. */
		if (pop->realloc_copy) {
			struct pollfd *tmp = mm_realloc(pop->event_set_copy,
			    pop->event_count * sizeof(struct pollfd));
			if (tmp == NULL) {
				event_warn("realloc");
				return -1;
			}
			pop->event_set_copy = tmp;
			pop->realloc_copy = 0;
		}
		memcpy(pop->event_set_copy, pop->event_set,
		    sizeof(struct pollfd)*nfds);
		event_set = pop->event_set_copy;
	} else {
		event_set = pop->event_set;
	}
#else
	event_set = pop->event_set;
#endif

	if (tv != NULL) {
		msec = evutil_tv_to_msec_(tv);
		if (msec < 0 || msec > INT_MAX)
			msec = INT_MAX;
	}

	EVBASE_RELEASE_LOCK(base, th_base_lock);

	res = poll(event_set, nfds, msec);

	EVBASE_ACQUIRE_LOCK(base, th_base_lock);

	if (res == -1) {
		if (errno != EINTR) {
			event_warn("poll");
			return (-1);
		}

		return (0);
	}

	event_debug(("%s: poll reports %d", __func__, res));

	if (res == 0 || nfds == 0)
		return (0);

	i = evutil_weakrand_range_(&base->weakrand_seed, nfds);
	for (j = 0; j < nfds; j++) {
		int what;
		if (++i == nfds)
			i = 0;
		what = event_set[i].revents;
		if (!what)
			continue;

		res = 0;

		/* If the file gets closed notify */
		if (what & (POLLHUP|POLLERR|POLLNVAL))
			what |= POLLIN|POLLOUT;
		if (what & POLLIN)
			res |= EV_READ;
		if (what & POLLOUT)
			res |= EV_WRITE;
		if (res == 0)
			continue;

		evmap_io_active_(base, event_set[i].fd, res);
	}

	return (0);
}